

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
OpenMD::SelectionSet::nextOffBit
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,SelectionSet *this,
          vector<int,_std::allocator<int>_> *fromIndex)

{
  int iVar1;
  long lVar2;
  int i;
  long lVar3;
  allocator_type local_29;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,6,&local_29);
  lVar2 = 0;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    iVar1 = OpenMDBitSet::nextOffBit
                      ((OpenMDBitSet *)
                       ((long)&(((this->bitsets_).
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_> + lVar2),
                       (fromIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[lVar3]);
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start[lVar3] = iVar1;
    lVar2 = lVar2 + 0x28;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> SelectionSet::nextOffBit(std::vector<int> fromIndex) const {
    std::vector<int> result(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].nextOffBit(fromIndex[i]);
    return result;
  }